

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

Shape tabwidgetPositionToTabBarShape(QWidget *w)

{
  QDockWidget *pQVar1;
  QWidgetPrivate *pQVar2;
  Shape result;
  Shape local_c;
  
  local_c = RoundedSouth;
  pQVar1 = qobject_cast<QDockWidget*>((QObject *)0x5fcfeb);
  if (pQVar1 != (QDockWidget *)0x0) {
    pQVar2 = qt_widget_private((QWidget *)0x5fcffb);
    switch(*(undefined4 *)&pQVar2->field_0x254) {
    case 0:
      local_c = RoundedNorth;
      break;
    case 1:
      local_c = RoundedSouth;
      break;
    case 2:
      local_c = RoundedWest;
      break;
    case 3:
      local_c = RoundedEast;
    }
  }
  return local_c;
}

Assistant:

static QTabBar::Shape tabwidgetPositionToTabBarShape(QWidget *w)
{
    QTabBar::Shape result = QTabBar::RoundedSouth;
    if (qobject_cast<QDockWidget *>(w)) {
        switch (static_cast<QDockWidgetPrivate *>(qt_widget_private(w))->tabPosition) {
        case QTabWidget::North:
            result = QTabBar::RoundedNorth;
            break;
        case QTabWidget::South:
            result = QTabBar::RoundedSouth;
            break;
        case QTabWidget::West:
            result = QTabBar::RoundedWest;
            break;
        case QTabWidget::East:
            result = QTabBar::RoundedEast;
            break;
        }
    }
    return result;
}